

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_catalog_entry.cpp
# Opt level: O0

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::ViewCatalogEntry::GetInfo(ViewCatalogEntry *this)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  pointer pCVar4;
  pointer pSVar5;
  vector<duckdb::Value,_true> *this_00;
  long in_RSI;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_> in_RDI;
  templated_unique_single_t result;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffed8;
  Value *in_stack_fffffffffffffee0;
  Value *in_stack_fffffffffffffee8;
  undefined1 local_38 [56];
  
  make_uniq<duckdb::CreateViewInfo>();
  lVar2 = *(long *)(in_RSI + 0xe0);
  pCVar4 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)in_stack_fffffffffffffee0);
  ::std::__cxx11::string::operator=
            ((string *)&(pCVar4->super_CreateInfo).schema,(string *)(lVar2 + 0x20));
  pCVar4 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)in_stack_fffffffffffffee0);
  ::std::__cxx11::string::operator=((string *)&pCVar4->view_name,(string *)(in_RSI + 0x20));
  pCVar4 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)in_stack_fffffffffffffee0);
  ::std::__cxx11::string::operator=
            ((string *)&(pCVar4->super_CreateInfo).sql,(string *)(in_RSI + 0x128));
  bVar3 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                      *)0x14fec81);
  if (bVar3) {
    pSVar5 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                           *)in_stack_fffffffffffffee0);
    (*(pSVar5->super_SQLStatement)._vptr_SQLStatement[3])(local_38);
    unique_ptr_cast<duckdb::SQLStatement,duckdb::SelectStatement>
              ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               in_stack_fffffffffffffee8);
  }
  else {
    unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>::
    unique_ptr<std::default_delete<duckdb::SelectStatement>,void>
              ((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::operator->
            ((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              *)in_stack_fffffffffffffee0);
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::operator=
            ((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              *)in_stack_fffffffffffffee0,
             (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              *)in_stack_fffffffffffffed8);
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
  ~unique_ptr((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
               *)0x14fed3a);
  if (bVar3) {
    unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::~unique_ptr
              ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               0x14fed53);
  }
  unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::operator->
            ((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              *)in_stack_fffffffffffffee0);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffee0,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffed8);
  unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::operator->
            ((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              *)in_stack_fffffffffffffee0);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffee0,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffed8);
  unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::operator->
            ((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              *)in_stack_fffffffffffffee0);
  vector<duckdb::LogicalType,_true>::operator=
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffee0,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffed8);
  bVar1 = *(byte *)(in_RSI + 0x41);
  pCVar4 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)in_stack_fffffffffffffee0);
  (pCVar4->super_CreateInfo).temporary = (bool)(bVar1 & 1);
  unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::operator->
            ((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              *)in_stack_fffffffffffffee0);
  LogicalDependencyList::operator=
            ((LogicalDependencyList *)in_stack_fffffffffffffee0,
             (LogicalDependencyList *)in_stack_fffffffffffffed8);
  unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::operator->
            ((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              *)in_stack_fffffffffffffee0);
  Value::operator=(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::operator->
            ((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              *)in_stack_fffffffffffffee0);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  this_00 = (vector<duckdb::Value,_true> *)(in_RSI + 400);
  unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::operator->
            ((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              *)this_00);
  vector<duckdb::Value,_true>::operator=
            (this_00,(vector<duckdb::Value,_true> *)in_stack_fffffffffffffed8);
  unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>::
  unique_ptr<duckdb::CreateViewInfo,std::default_delete<std::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>>>,void>
            ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             this_00,(unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>_>
                      *)in_stack_fffffffffffffed8);
  unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              *)0x14fef61);
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (__uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
         super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CreateInfo> ViewCatalogEntry::GetInfo() const {
	auto result = make_uniq<CreateViewInfo>();
	result->schema = schema.name;
	result->view_name = name;
	result->sql = sql;
	result->query = query ? unique_ptr_cast<SQLStatement, SelectStatement>(query->Copy()) : nullptr;
	result->aliases = aliases;
	result->names = names;
	result->types = types;
	result->temporary = temporary;
	result->dependencies = dependencies;
	result->comment = comment;
	result->tags = tags;
	result->column_comments = column_comments;
	return std::move(result);
}